

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcscan.c
# Opt level: O1

int gcscan2(int probe)

{
  ulong uVar1;
  
  uVar1 = (ulong)(uint)probe;
  do {
    uVar1 = uVar1 - 1;
    if (probe < 1) {
      return -1;
    }
    probe = probe + -1;
  } while ((HTmain[uVar1 & 0xffffffff] & 0x10001) == 0);
  return probe;
}

Assistant:

int gcscan2(int probe)
/* probe is offset */
{
  struct htlinkptr *htlptr; /* overlay access method */
  while (--probe >= 0)               /* End of HTmain Table ? */
  {
    htlptr = (struct htlinkptr *)(HTmain + probe);
    /* Start addr. of scanning */
    if (((HTSTKBIT | 1) & ((struct htlinkptr *)GCPTR(htlptr))->contents) != 0)
      return (probe); /* stackref or collision ON */
  }
  return (-1);
}